

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerPagecount(Pager *pPager,Pgno *pnPage)

{
  long lVar1;
  Pgno PVar2;
  uint *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int rc;
  Pgno nPage;
  i64 n;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PVar2 = sqlite3WalDbsize(*(Wal **)(in_RDI + 0x128));
  if ((PVar2 == 0) && (**(long **)(in_RDI + 0x48) != 0)) {
    local_14 = sqlite3OsFileSize((sqlite3_file *)(ulong)in_stack_ffffffffffffffd0,
                                 (i64 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
    if (local_14 != 0) goto LAB_0016a3ba;
    PVar2 = (Pgno)((*(long *)(in_RDI + 200) + -1) / *(long *)(in_RDI + 200));
  }
  if (*(uint *)(in_RDI + 0xbc) < PVar2) {
    *(Pgno *)(in_RDI + 0xbc) = PVar2;
  }
  *in_RSI = PVar2;
  local_14 = 0;
LAB_0016a3ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int pagerPagecount(Pager *pPager, Pgno *pnPage){
  Pgno nPage;                     /* Value to return via *pnPage */

  /* Query the WAL sub-system for the database size. The WalDbsize()
  ** function returns zero if the WAL is not open (i.e. Pager.pWal==0), or
  ** if the database size is not available. The database size is not
  ** available from the WAL sub-system if the log file is empty or
  ** contains no valid committed transactions.
  */
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );
  assert( isOpen(pPager->fd) );
  assert( pPager->tempFile==0 );
  nPage = sqlite3WalDbsize(pPager->pWal);

  /* If the number of pages in the database is not available from the
  ** WAL sub-system, determine the page count based on the size of
  ** the database file.  If the size of the database file is not an
  ** integer multiple of the page-size, round up the result.
  */
  if( nPage==0 && ALWAYS(isOpen(pPager->fd)) ){
    i64 n = 0;                    /* Size of db file in bytes */
    int rc = sqlite3OsFileSize(pPager->fd, &n);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nPage = (Pgno)((n+pPager->pageSize-1) / pPager->pageSize);
  }

  /* If the current number of pages in the file is greater than the
  ** configured maximum pager number, increase the allowed limit so
  ** that the file can be read.
  */
  if( nPage>pPager->mxPgno ){
    pPager->mxPgno = (Pgno)nPage;
  }

  *pnPage = nPage;
  return SQLITE_OK;
}